

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_bwt.hpp
# Opt level: O1

p_range * __thiscall
dna_bwt<dna_string>::LF(p_range *__return_storage_ptr__,dna_bwt<dna_string> *this,range_t rn)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  p_rank start;
  p_rank local_68;
  p_rank local_48;
  
  dna_string::parallel_rank(&local_68,&this->BWT,rn.first);
  uVar5 = local_68.A;
  uVar6 = local_68.C;
  uVar7 = local_68.G;
  uVar8 = local_68.T;
  if (rn.first < rn.second) {
    dna_string::parallel_rank(&local_48,&this->BWT,rn.second);
    uVar5 = local_48.A;
    uVar6 = local_48.C;
    uVar7 = local_48.G;
    uVar8 = local_48.T;
  }
  uVar1 = this->F_A;
  uVar2 = this->F_C;
  uVar3 = this->F_G;
  uVar4 = this->F_T;
  (__return_storage_ptr__->A).first = local_68.A + uVar1;
  (__return_storage_ptr__->A).second = uVar5 + uVar1;
  (__return_storage_ptr__->C).first = local_68.C + uVar2;
  (__return_storage_ptr__->C).second = uVar6 + uVar2;
  (__return_storage_ptr__->G).first = local_68.G + uVar3;
  (__return_storage_ptr__->G).second = uVar7 + uVar3;
  (__return_storage_ptr__->T).first = local_68.T + uVar4;
  (__return_storage_ptr__->T).second = uVar8 + uVar4;
  return __return_storage_ptr__;
}

Assistant:

p_range LF(range_t rn){

		assert(rn.second >= rn.first);

		//number of A,C,T,G before start of interval
		p_rank start = BWT.parallel_rank(rn.first);

		//number of A,C,T,G before end of interval (last position of interval included)
		p_rank end;

		if(rn.second>rn.first)
			end	= BWT.parallel_rank(rn.second);
		else
			end = start;

		assert(start <= end);

		p_rank f = {F_A,F_C,F_G,F_T};
		p_rank l = f + start;
		p_rank r = f + end;

		assert(r.A <= l.C);
		assert(r.C <= l.G);
		assert(r.G <= l.T);
		assert(l.T <= n);

		return fold_ranks(l,r);

	}